

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_file_zip64.c
# Opt level: O1

void test_write_format_zip_file_zip64(void)

{
  int *_v1;
  long lVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  tm *ptVar7;
  void *pvVar8;
  archive *_a;
  archive_entry *entry;
  la_ssize_t v2;
  unsigned_long v2_00;
  unsigned_long_long uVar9;
  unsigned_long_long v1;
  ulong uVar10;
  int *p_;
  void *pvVar11;
  void *pvVar12;
  int *v2_01;
  time_t t;
  char file_data [8];
  size_t used;
  tm_conflict tmbuf;
  time_t local_b0;
  void *local_a8;
  undefined8 local_a0;
  long local_98;
  ulong local_90;
  void *local_88;
  void *local_80;
  unsigned_long local_78;
  size_t local_70;
  tm local_68;
  
  local_b0 = 0x499602d2;
  local_a0 = 0x3837363534333231;
  ptVar7 = localtime_r(&local_b0,&local_68);
  pvVar8 = malloc(1000000);
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                   ,L'I',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar4 = archive_write_set_format_zip(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar4,"archive_write_set_format_zip(a)",_a);
  iVar4 = archive_write_set_options(_a,"zip:zip64");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar4,"archive_write_set_options(a, \"zip:zip64\")"
                      ,_a);
  iVar4 = archive_write_set_options(_a,"zip:experimental");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_write_set_options(a, \"zip:experimental\")",_a);
  iVar4 = archive_write_open_memory(_a,pvVar8,1000000,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'P',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_write_open_memory(a, buff, buffsize, &used)",_a);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                   ,L'R',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname(entry,"file");
  archive_entry_set_mode(entry,0x81a4);
  archive_entry_set_size(entry,8);
  archive_entry_set_uid(entry,10);
  archive_entry_set_gid(entry,0x14);
  archive_entry_set_mtime(entry,local_b0,0);
  iVar4 = archive_write_header(_a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Y',0,"0",(long)iVar4,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(entry);
  v2 = archive_write_data(_a,&local_a0,8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'[',8,"8",v2,"archive_write_data(a, file_data, sizeof(file_data))",
                      (void *)0x0);
  iVar4 = archive_write_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\\',0,"ARCHIVE_OK",(long)iVar4,"archive_write_close(a)",_a);
  iVar4 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L']',0,"ARCHIVE_OK",(long)iVar4,"archive_write_free(a)",(void *)0x0);
  dumpfile("constructed.zip",pvVar8,local_70);
  pvVar11 = (void *)((long)pvVar8 + (local_70 - 0x16));
  failure("End-of-central-directory begins with PK\\005\\006 signature");
  local_80 = pvVar11;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'e',pvVar11,"p","PK\x05\x06","\"PK\\005\\006\"",4,"4",(void *)0x0);
  failure("This must be disk 0");
  uVar2 = i2le((void *)((long)pvVar8 + (local_70 - 0x12)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'g',(ulong)uVar2,"i2le(p + 4)",0,"0",(void *)0x0);
  failure("Central dir must start on disk 0");
  uVar2 = i2le((void *)((long)pvVar8 + (local_70 - 0x10)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'i',(ulong)uVar2,"i2le(p + 6)",0,"0",(void *)0x0);
  failure("All central dir entries are on this disk");
  uVar2 = i2le((void *)((long)pvVar8 + (local_70 - 0xe)));
  uVar3 = i2le((void *)((long)pvVar8 + (local_70 - 0xc)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'k',(ulong)uVar2,"i2le(p + 8)",(ulong)uVar3,"i2le(p + 10)",(void *)0x0);
  pvVar12 = (void *)((long)pvVar8 + (local_70 - 10));
  uVar5 = i4le(pvVar12);
  pvVar11 = (void *)((long)pvVar8 + (local_70 - 6));
  uVar6 = i4le(pvVar11);
  local_88 = (void *)((long)pvVar8 + (ulong)uVar6 + (ulong)uVar5);
  failure("no zip comment");
  uVar2 = i2le((void *)((long)pvVar8 + (local_70 - 2)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'n',(ulong)uVar2,"i2le(p + 20)",0,"0",(void *)0x0);
  uVar5 = i4le(pvVar11);
  uVar10 = (ulong)uVar5;
  _v1 = (int *)((long)pvVar8 + uVar10);
  uVar5 = i4le(pvVar12);
  failure("Central file record at offset %u should begin with PK\\001\\002 signature",(ulong)uVar5);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'w',_v1,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  uVar2 = i2le(_v1 + 1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'x',(ulong)uVar2,"i2le(p + 4)",0x32d,"3 * 256 + zip_version",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + uVar10 + 6));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'y',(ulong)uVar2,"i2le(p + 6)",0x2d,"zip_version",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + uVar10 + 8));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'z',(ulong)uVar2,"i2le(p + 8)",8,"8",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + uVar10 + 10));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'{',(ulong)uVar2,"i2le(p + 10)",8,"zip_compression",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + uVar10 + 0xc));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'|',(ulong)uVar2,"i2le(p + 12)",
                      (long)(ptVar7->tm_sec / 2 + ptVar7->tm_min * 0x20 + ptVar7->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + uVar10 + 0xe));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'}',(ulong)uVar2,"i2le(p + 14)",
                      (long)(ptVar7->tm_mon * 0x20 + ptVar7->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar7->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  v2_00 = bitcrc32(0,&local_a0,8);
  uVar5 = i4le((void *)((long)pvVar8 + uVar10 + 0x10));
  local_78 = v2_00;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x7f',(ulong)uVar5,"i4le(p + 16)",v2_00,"crc",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar8 + uVar10 + 0x18));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x81',(ulong)uVar5,"i4le(p + 24)",8,"sizeof(file_data)",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + uVar10 + 0x1c));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x82',(ulong)uVar2,"i2le(p + 28)",4,"strlen(file_name)",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + uVar10 + 0x20));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x84',(ulong)uVar2,"i2le(p + 32)",0,"0",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + uVar10 + 0x22));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x85',(ulong)uVar2,"i2le(p + 34)",0,"0",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + uVar10 + 0x24));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x86',(ulong)uVar2,"i2le(p + 36)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar8 + uVar10 + 0x26));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x87',(ulong)(uVar5 >> 0x10 & 0x3ff),"i4le(p + 38) >> 16 & 01777",0x1a4,
                      "file_perm",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar8 + uVar10 + 0x2a));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x88',(ulong)uVar5,"i4le(p + 42)",0,"0",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x89',(void *)((long)pvVar8 + uVar10 + 0x2e),"p + 46","file","file_name",4,
                      "strlen(file_name)",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + uVar10 + 0x1e));
  pvVar12 = (void *)((long)_v1 + (ulong)uVar2 + 0x32);
  uVar2 = i2le((void *)((long)pvVar8 + uVar10 + 0x32));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x8d',(ulong)uVar2,"i2le(p)",0x7875,"0x7875",(void *)0x0);
  pvVar11 = (void *)((long)pvVar8 + uVar10 + 0x34);
  local_a8 = pvVar8;
  local_90 = uVar10;
  uVar2 = i2le(pvVar11);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x8e',(ulong)uVar2,"i2le(p + 2)",0xb,"11",(void *)0x0);
  uVar2 = i2le(pvVar11);
  uVar10 = (ulong)uVar2;
  local_98 = (long)_v1 + uVar10 + 0x32;
  uVar2 = i2le((void *)((long)_v1 + uVar10 + 0x36));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x92',(ulong)uVar2,"i2le(p)",0x5455,"0x5455",(void *)0x0);
  pvVar8 = (void *)((long)_v1 + uVar10 + 0x38);
  uVar2 = i2le(pvVar8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x93',(ulong)uVar2,"i2le(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x94',(ulong)*(byte *)((long)_v1 + uVar10 + 0x3a),"p[4]",1,"1",(void *)0x0)
  ;
  uVar5 = i4le((void *)((long)_v1 + uVar10 + 0x3b));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'\x95',(ulong)uVar5,"i4le(p + 5)",local_b0,"t",(void *)0x0);
  uVar2 = i2le(pvVar8);
  for (pvVar8 = (void *)((ulong)uVar2 + local_98 + 8); pvVar8 < pvVar12;
      pvVar8 = (void *)((long)pvVar8 + (ulong)uVar2 + 4)) {
    uVar2 = i2le(pvVar8);
    failure("Unexpected extension 0x%04X",(ulong)uVar2);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                     ,L'¡',L'\0',"0",(void *)0x0);
    uVar2 = i2le((void *)((long)pvVar8 + 2));
  }
  assertion_equal_address
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
             ,L'¦',pvVar8,"p",pvVar12,"extension_end",(void *)0x0);
  pvVar12 = local_88;
  assertion_equal_address
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
             ,L'¨',pvVar8,"p",local_88,"eocd",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'«',pvVar8,"p","PK\x06\x06","\"PK\\006\\006\"",4,"4",(void *)0x0);
  uVar9 = i8le((void *)((long)pvVar8 + 4));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'¬',uVar9,"i8le(p + 4)",0x2c,"44",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + 0xc));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'­',(ulong)uVar2,"i2le(p + 12)",0x2d,"45",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar8 + 0xe));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'®',(ulong)uVar2,"i2le(p + 14)",0x2d,"45",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar8 + 0x10));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'¯',(ulong)uVar5,"i4le(p + 16)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar8 + 0x14));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'°',(ulong)uVar5,"i4le(p + 20)",0,"0",(void *)0x0);
  uVar9 = i8le((void *)((long)pvVar8 + 0x18));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'±',uVar9,"i8le(p + 24)",1,"1",(void *)0x0);
  uVar9 = i8le((void *)((long)pvVar8 + 0x20));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'²',uVar9,"i8le(p + 32)",1,"1",(void *)0x0);
  uVar9 = i8le((void *)((long)pvVar8 + 0x28));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'³',uVar9,"i8le(p + 40)",(long)pvVar12 - (long)_v1,"eocd - central_header",
                      (void *)0x0);
  uVar9 = i8le((void *)((long)pvVar8 + 0x30));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'´',uVar9,"i8le(p + 48)",local_90,"central_header - buff",(void *)0x0);
  uVar9 = i8le((void *)((long)pvVar8 + 4));
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'·',(void *)((long)pvVar8 + uVar9 + 0xc),"p","PK\x06\a","\"PK\\006\\007\"",
                      4,"4",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar8 + uVar9 + 0x10));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'¸',(ulong)uVar5,"i4le(p + 4)",0,"0",(void *)0x0);
  v1 = i8le((void *)((long)pvVar8 + uVar9 + 0x14));
  pvVar11 = local_a8;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'¹',v1,"i8le(p + 8)",(long)pvVar12 - (long)local_a8,"eocd - buff",
                      (void *)0x0);
  uVar5 = i4le((void *)((long)pvVar8 + uVar9 + 0x1c));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'º',(ulong)uVar5,"i4le(p + 16)",1,"1",(void *)0x0);
  assertion_equal_address
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
             ,L'¾',(void *)((long)pvVar8 + uVar9 + 0x20),"p",local_80,"eocd_record",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Â',pvVar11,"p","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + 4));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ã',(ulong)uVar2,"i2le(p + 4)",0x2d,"zip_version",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + 6));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ä',(ulong)uVar2,"i2le(p + 6)",8,"8",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + 8));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Å',(ulong)uVar2,"i2le(p + 8)",8,"zip_compression",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + 10));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Æ',(ulong)uVar2,"i2le(p + 10)",
                      (long)(ptVar7->tm_sec / 2 + ptVar7->tm_min * 0x20 + ptVar7->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + 0xc));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ç',(ulong)uVar2,"i2le(p + 12)",
                      (long)(ptVar7->tm_mon * 0x20 + ptVar7->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar7->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  uVar5 = i4le((void *)((long)pvVar11 + 0xe));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'È',(ulong)uVar5,"i4le(p + 14)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar11 + 0x12));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'É',(ulong)uVar5,"i4le(p + 18)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar11 + 0x16));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ê',(ulong)uVar5,"i4le(p + 22)",0,"0",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + 0x1a));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ë',(ulong)uVar2,"i2le(p + 26)",4,"strlen(file_name)",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + 0x1c));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ì',(ulong)uVar2,"i2le(p + 28)",0x25,"37",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Í',(void *)((long)pvVar11 + 0x1e),"p + 30","file","file_name",4,
                      "strlen(file_name)",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + 0x1c));
  v2_01 = (int *)((long)pvVar11 + (ulong)uVar2 + 0x22);
  uVar2 = i2le((void *)((long)pvVar11 + 0x22));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ñ',(ulong)uVar2,"i2le(p)",0x7875,"0x7875",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + 0x24));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ò',(ulong)uVar2,"i2le(p + 2)",0xb,"11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ó',(ulong)*(byte *)((long)pvVar11 + 0x26),"p[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ô',(ulong)*(byte *)((long)pvVar11 + 0x27),"p[5]",4,"4",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar11 + 0x28));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Õ',(ulong)uVar5,"i4le(p + 6)",10,"file_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ö',(ulong)*(byte *)((long)pvVar11 + 0x2c),"p[10]",4,"4",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar11 + 0x2d));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'×',(ulong)uVar5,"i4le(p + 11)",0x14,"file_gid",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + 0x24));
  uVar10 = (ulong)uVar2;
  lVar1 = uVar10 + 0x22;
  uVar2 = i2le((void *)((long)pvVar11 + uVar10 + 0x26));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ú',(ulong)uVar2,"i2le(p)",0x5455,"0x5455",(void *)0x0);
  pvVar8 = (void *)((long)pvVar11 + uVar10 + 0x28);
  uVar2 = i2le(pvVar8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Û',(ulong)uVar2,"i2le(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ü',(ulong)*(byte *)((long)pvVar11 + uVar10 + 0x2a),"p[4]",1,"1",
                      (void *)0x0);
  uVar5 = i4le((void *)((long)pvVar11 + uVar10 + 0x2b));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'Ý',(ulong)uVar5,"i4le(p + 5)",local_b0,"t",(void *)0x0);
  uVar2 = i2le(pvVar8);
  uVar10 = (ulong)uVar2;
  uVar2 = i2le((void *)((long)pvVar11 + uVar10 + lVar1 + 8));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'à',(ulong)uVar2,"i2le(p)",0x6c78,"0x6c78",(void *)0x0);
  pvVar8 = (void *)((long)pvVar11 + uVar10 + lVar1 + 10);
  uVar2 = i2le(pvVar8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'á',(ulong)uVar2,"i2le(p + 2)",9,"9",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'â',(ulong)*(byte *)((long)pvVar11 + uVar10 + lVar1 + 0xc),"p[4]",7,"7",
                      (void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + uVar10 + lVar1 + 0xd));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ã',(ulong)(uVar2 >> 8),"i2le(p + 5) >> 8",3,"3",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar11 + uVar10 + lVar1 + 0xf));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ä',(ulong)uVar2,"i2le(p + 7)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar11 + uVar10 + lVar1 + 0x11));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'å',(ulong)(uVar5 >> 0x10 & 0x3ff),"i4le(p + 9) >> 16 & 01777",0x1a4,
                      "file_perm",(void *)0x0);
  uVar2 = i2le(pvVar8);
  for (p_ = (int *)((long)pvVar11 + (ulong)uVar2 + uVar10 + lVar1 + 0xc); p_ < v2_01;
      p_ = (int *)((long)p_ + (ulong)uVar2 + 4)) {
    uVar2 = i2le(p_);
    failure("Unexpected extension 0x%04X",(ulong)uVar2);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                     ,L'ë',L'\0',"0",(void *)0x0);
    uVar2 = i2le((void *)((long)p_ + 2));
  }
  assertion_equal_address
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
             ,L'ð',p_,"p",v2_01,"extension_end",(void *)0x0);
  for (; (p_ < _v1 && (*p_ != 0x8074b50)); p_ = (int *)((long)p_ + 1)) {
  }
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'õ',p_,"p","PK\a\b","\"PK\\007\\010\"",4,"4",(void *)0x0);
  uVar5 = i4le(p_ + 1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ö',(ulong)uVar5,"i4le(p + 4)",local_78,"crc",(void *)0x0);
  uVar9 = i8le(p_ + 2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'÷',uVar9,"i8le(p + 8)",(long)p_ - (long)v2_01,"p - extension_end",
                      (void *)0x0);
  uVar9 = i8le(p_ + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
                      ,L'ø',uVar9,"i8le(p + 16)",8,"sizeof(file_data)",(void *)0x0);
  assertion_equal_address
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip_file_zip64.c"
             ,L'û',p_ + 6,"p + 24",_v1,"central_header",(void *)0x0);
  free(local_a8);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_file_zip64)
{
	struct archive *a;
	struct archive_entry *ae;
	time_t t = 1234567890;
	struct tm *tm;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm tmbuf;
#endif
	size_t used, buffsize = 1000000;
	unsigned long crc;
	int file_perm = 00644;
	int zip_version = 45;
	int zip_compression = 8;
	short file_uid = 10, file_gid = 20;
	unsigned char *buff, *buffend, *p;
	unsigned char *central_header, *local_header, *eocd, *eocd_record;
	unsigned char *extension_start, *extension_end;
	char file_data[] = {'1', '2', '3', '4', '5', '6', '7', '8'};
	const char *file_name = "file";

#ifndef HAVE_ZLIB_H
	zip_compression = 0;
#endif

#if defined(HAVE_LOCALTIME_S)
	tm = localtime_s(&tmbuf, &t) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
	tm = localtime_r(&t, &tmbuf);
#else
	tm = localtime(&t);
#endif
	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:zip64"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, file_name);
	archive_entry_set_mode(ae, AE_IFREG | file_perm);
	archive_entry_set_size(ae, sizeof(file_data));
	archive_entry_set_uid(ae, file_uid);
	archive_entry_set_gid(ae, file_gid);
	archive_entry_set_mtime(ae, t, 0);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, file_data, sizeof(file_data)));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	buffend = buff + used;
	dumpfile("constructed.zip", buff, used);

	/* Verify "End of Central Directory" record. */
	/* Get address of end-of-central-directory record. */
	eocd_record = p = buffend - 22; /* Assumes there is no zip comment field. */
	failure("End-of-central-directory begins with PK\\005\\006 signature");
	assertEqualMem(p, "PK\005\006", 4);
	failure("This must be disk 0");
	assertEqualInt(i2le(p + 4), 0);
	failure("Central dir must start on disk 0");
	assertEqualInt(i2le(p + 6), 0);
	failure("All central dir entries are on this disk");
	assertEqualInt(i2le(p + 8), i2le(p + 10));
	eocd = buff + i4le(p + 12) + i4le(p + 16);
	failure("no zip comment");
	assertEqualInt(i2le(p + 20), 0);

	/* Get address of first entry in central directory. */
	central_header = p = buff + i4le(buffend - 6);
	failure("Central file record at offset %u should begin with"
	    " PK\\001\\002 signature",
	    i4le(buffend - 10));

	/* Verify file entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2le(p + 4), 3 * 256 + zip_version); /* Version made by */
	assertEqualInt(i2le(p + 6), zip_version); /* Version needed to extract */
	assertEqualInt(i2le(p + 8), 8); /* Flags */
	assertEqualInt(i2le(p + 10), zip_compression); /* Compression method */
	assertEqualInt(i2le(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2le(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = bitcrc32(0, file_data, sizeof(file_data));
	assertEqualInt(i4le(p + 16), crc); /* CRC-32 */
	/* assertEqualInt(i4le(p + 20), sizeof(file_data)); */ /* Compressed size */
	assertEqualInt(i4le(p + 24), sizeof(file_data)); /* Uncompressed size */
	assertEqualInt(i2le(p + 28), strlen(file_name)); /* Pathname length */
	/* assertEqualInt(i2le(p + 30), 28); */ /* Extra field length: See below */
	assertEqualInt(i2le(p + 32), 0); /* File comment length */
	assertEqualInt(i2le(p + 34), 0); /* Disk number start */
	assertEqualInt(i2le(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4le(p + 38) >> 16 & 01777, file_perm); /* External file attrs */
	assertEqualInt(i4le(p + 42), 0); /* Offset of local header */
	assertEqualMem(p + 46, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = central_header + 46 + strlen(file_name);
	extension_end = extension_start + i2le(central_header + 30);

	assertEqualInt(i2le(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2le(p + 2), 11); /* 'ux' size */
	/* TODO: verify 'ux' contents */
	p += 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2le(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4le(p + 5), t); /* 'UT' mtime */
	p += 4 + i2le(p + 2);

	/* Note: We don't expect to see zip64 extension in the central
	 * directory, since the writer knows the actual full size by
	 * the time it is ready to write the central directory and has
	 * no reason to insert it then.  Info-Zip seems to do the same
	 * thing. */

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2le(p));
		assert(0);
		p += 4 + i2le(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assertEqualAddress(p, extension_end);

	assertEqualAddress(p, eocd);

	/* After Central dir, we find Zip64 eocd and Zip64 eocd locator. */
	assertEqualMem(p, "PK\006\006", 4); /* Zip64 eocd */
	assertEqualInt(i8le(p + 4), 44); /* We're using v1 Zip64 eocd */
	assertEqualInt(i2le(p + 12), 45); /* Written by Version 4.5 */
	assertEqualInt(i2le(p + 14), 45); /* Needs version 4.5 to extract */
	assertEqualInt(i4le(p + 16), 0); /* This is disk #0 */
	assertEqualInt(i4le(p + 20), 0); /* Dir starts on disk #0 */
	assertEqualInt(i8le(p + 24), 1); /* 1 entry on this disk */
	assertEqualInt(i8le(p + 32), 1); /* 1 entry total */
	assertEqualInt(i8le(p + 40), eocd - central_header); /* size of cd */
	assertEqualInt(i8le(p + 48), central_header - buff); /* start of cd */
	p += 12 + i8le(p + 4);

	assertEqualMem(p, "PK\006\007", 4); /* Zip64 eocd locator */
	assertEqualInt(i4le(p + 4), 0); /* Zip64 eocd is on disk #0 */
	assertEqualInt(i8le(p + 8), eocd - buff); /* Offset of Zip64 eocd */
	assertEqualInt(i4le(p + 16), 1); /* 1 disk */
	p += 20;

	/* Regular EOCD immediately follows Zip64 records. */
	assertEqualAddress(p, eocd_record);

	/* Verify local header of file entry. */
	p = local_header = buff;
	assertEqualMem(p, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2le(p + 4), zip_version); /* Version needed to extract */
	assertEqualInt(i2le(p + 6), 8); /* Flags: bit 3 = length-at-end */
	assertEqualInt(i2le(p + 8), zip_compression); /* Compression method */
	assertEqualInt(i2le(p + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2le(p + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4le(p + 14), 0); /* CRC-32 must be 0 because of length-at-end */
	assertEqualInt(i4le(p + 18), 0); /* Compressed size must be 0 because of length-at-end */
	assertEqualInt(i4le(p + 22), 0); /* Uncompressed size must be 0 because of length-at-end. */
	assertEqualInt(i2le(p + 26), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2le(p + 28), 37); /* Extra field length */
	assertEqualMem(p + 30, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = local_header + 30 + strlen(file_name);
	extension_end = extension_start + i2le(local_header + 28);

	assertEqualInt(i2le(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2le(p + 2), 11); /* 'ux' size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4le(p + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4le(p + 11), file_gid); /* 'Ux' GID */
	p += 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2le(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4le(p + 5), t); /* 'UT' mtime */
	p += 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x6c78); /* 'xl' experimental extension header */
	assertEqualInt(i2le(p + 2), 9); /* size */
	assertEqualInt(p[4], 7); /* bitmap of included fields */
	assertEqualInt(i2le(p + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2le(p + 7), 0); /* internal file attributes */
	assertEqualInt(i4le(p + 9) >> 16 & 01777, file_perm); /* external file attributes */
	p += 4 + i2le(p + 2);

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2le(p));
		assert(0);
		p += 4 + i2le(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assertEqualAddress(p, extension_end);

	/* Data descriptor should follow compressed data. */
	while (p < central_header && memcmp(p, "PK\007\010", 4) != 0)
		++p;
	assertEqualMem(p, "PK\007\010", 4);
	assertEqualInt(i4le(p + 4), crc); /* CRC-32 */
	assertEqualInt(i8le(p + 8), p - extension_end); /* compressed size */
	assertEqualInt(i8le(p + 16), sizeof(file_data)); /* uncompressed size */

	/* Central directory should immediately follow the only entry. */
	assertEqualAddress(p + 24, central_header);

	free(buff);
}